

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_ptime.c
# Opt level: O1

uint fmt_taia(char *s,taia *t)

{
  long lVar1;
  
  taia_pack(fmt_taia::pack,t);
  *s = '@';
  lVar1 = 0;
  do {
    s[lVar1 * 2 + 1] = "0123456789abcdef"[(byte)fmt_taia::pack[lVar1] >> 4];
    s[lVar1 * 2 + 2] = "0123456789abcdef"[(byte)fmt_taia::pack[lVar1] & 0xf];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc);
  return 0x19;
}

Assistant:

unsigned int fmt_taia(char *s, struct taia *t) {
  static char hex[16] ="0123456789abcdef";
  static char pack[TAIA_PACK];
  int i;

  taia_pack(pack, t);
  s[0] ='@';
  for (i =0; i < 12; ++i) {
    s[i *2 +1] =hex[(pack[i] >>4) &15];
    s[i *2 +2] =hex[pack[i] &15];
  }
  return(25);
}